

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::DefaultInstanceName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor,Options *options)

{
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Descriptor *local_20;
  Options *options_local;
  Descriptor *descriptor_local;
  
  local_20 = descriptor;
  options_local = (Options *)this;
  descriptor_local = (Descriptor *)__return_storage_ptr__;
  ClassName_abi_cxx11_(&local_60,this,(Descriptor *)0x0,SUB81(options,0));
  std::operator+(&local_40,"_",&local_60);
  std::operator+(__return_storage_ptr__,&local_40,"_default_instance_");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultInstanceName(const Descriptor* descriptor,
                                const Options& options) {
  return "_" + ClassName(descriptor, false) + "_default_instance_";
}